

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_550beb::NameType::printLeft(NameType *this,OutputStream *s)

{
  char *__src;
  size_t N;
  
  __src = (this->Name).First;
  N = (long)(this->Name).Last - (long)__src;
  if (N != 0) {
    OutputStream::grow(s,N);
    memmove(s->Buffer + s->CurrentPosition,__src,N);
    s->CurrentPosition = s->CurrentPosition + N;
  }
  return;
}

Assistant:

void printLeft(OutputStream &s) const override { s += Name; }